

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O3

int32_t u_unescape_63(char *src,UChar *dest,int32_t destCapacity)

{
  uint uVar1;
  int iVar2;
  ulong in_RAX;
  size_t sVar3;
  int iVar4;
  int32_t iVar5;
  long lVar6;
  int32_t lenParsed;
  undefined8 uStack_38;
  
  iVar5 = 0;
  uStack_38 = in_RAX;
  while( true ) {
    lVar6 = 0;
    while( true ) {
      iVar2 = (int)lVar6;
      if (src[lVar6] == '\0') {
        if (lVar6 != 0) {
          if (dest != (UChar *)0x0) {
            iVar4 = 0;
            if (0 < destCapacity - iVar5) {
              iVar4 = destCapacity - iVar5;
            }
            if (iVar2 <= iVar4) {
              iVar4 = iVar2;
            }
            u_charsToUChars_63(src,dest + iVar5,iVar4);
          }
          iVar5 = iVar5 + iVar2;
        }
        if (dest == (UChar *)0x0) {
          return iVar5;
        }
        if (destCapacity <= iVar5) {
          return iVar5;
        }
        dest = dest + iVar5;
        goto LAB_0037893f;
      }
      if (src[lVar6] == '\\') break;
      lVar6 = lVar6 + 1;
    }
    uStack_38 = uStack_38 & 0xffffffff;
    if (lVar6 != 0) {
      if (dest != (UChar *)0x0) {
        iVar4 = destCapacity - iVar5;
        if (destCapacity - iVar5 < 1) {
          iVar4 = 0;
        }
        if (iVar2 <= iVar4) {
          iVar4 = iVar2;
        }
        u_charsToUChars_63(src,dest + iVar5,iVar4);
      }
      iVar5 = iVar5 + iVar2;
    }
    sVar3 = strlen(src + lVar6 + 1);
    uVar1 = u_unescapeAt_63(_charPtr_charAt,(int32_t *)((long)&uStack_38 + 4),(int32_t)sVar3,
                            src + lVar6 + 1);
    if ((long)uStack_38._4_4_ == 0) break;
    if ((dest == (UChar *)0x0) || (destCapacity - iVar5 < (int)(2 - (uint)(uVar1 < 0x10000)))) {
      iVar2 = 2 - (uint)(uVar1 < 0x10000);
    }
    else if (uVar1 < 0x10000) {
      dest[iVar5] = (UChar)uVar1;
      iVar2 = 1;
    }
    else {
      dest[iVar5] = (short)(uVar1 >> 10) + L'ퟀ';
      dest[(long)iVar5 + 1] = (UChar)uVar1 & 0x3ffU | 0xdc00;
      iVar2 = 2;
    }
    src = src + lVar6 + uStack_38._4_4_ + 1;
    iVar5 = iVar5 + iVar2;
  }
  iVar5 = 0;
  if (0 < destCapacity && dest != (UChar *)0x0) {
LAB_0037893f:
    *dest = L'\0';
  }
  return iVar5;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_unescape(const char *src, UChar *dest, int32_t destCapacity) {
    const char *segment = src;
    int32_t i = 0;
    char c;

    while ((c=*src) != 0) {
        /* '\\' intentionally written as compiler-specific
         * character constant to correspond to compiler-specific
         * char* constants. */
        if (c == '\\') {
            int32_t lenParsed = 0;
            UChar32 c32;
            if (src != segment) {
                if (dest != NULL) {
                    _appendUChars(dest + i, destCapacity - i,
                                  segment, (int32_t)(src - segment));
                }
                i += (int32_t)(src - segment);
            }
            ++src; /* advance past '\\' */
            c32 = (UChar32)u_unescapeAt(_charPtr_charAt, &lenParsed, (int32_t)uprv_strlen(src), (void*)src);
            if (lenParsed == 0) {
                goto err;
            }
            src += lenParsed; /* advance past escape seq. */
            if (dest != NULL && U16_LENGTH(c32) <= (destCapacity - i)) {
                U16_APPEND_UNSAFE(dest, i, c32);
            } else {
                i += U16_LENGTH(c32);
            }
            segment = src;
        } else {
            ++src;
        }
    }
    if (src != segment) {
        if (dest != NULL) {
            _appendUChars(dest + i, destCapacity - i,
                          segment, (int32_t)(src - segment));
        }
        i += (int32_t)(src - segment);
    }
    if (dest != NULL && i < destCapacity) {
        dest[i] = 0;
    }
    return i;

 err:
    if (dest != NULL && destCapacity > 0) {
        *dest = 0;
    }
    return 0;
}